

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

Diagnostic * __thiscall
slang::ast::EvalContext::addDiag(EvalContext *this,DiagCode code,SourceLocation location)

{
  DiagnosticSeverity DVar1;
  SourceLocation in_RDX;
  DiagCode in_ESI;
  Diagnostics *in_RDI;
  Diagnostic *diag;
  bool isError;
  Diagnostic *in_stack_000002c8;
  EvalContext *in_stack_000002d0;
  undefined8 local_58;
  SourceLocation in_stack_ffffffffffffffb8;
  DiagCode in_stack_ffffffffffffffc4;
  
  DVar1 = getDefaultSeverity(in_RDX._0_4_);
  if ((int)DVar1 < 3) {
    local_58 = Diagnostics::add(in_RDI,in_ESI,in_RDX);
  }
  else {
    local_58 = Diagnostics::add(in_RDI,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  }
  reportStack(in_stack_000002d0,in_stack_000002c8);
  return local_58;
}

Assistant:

Diagnostic& EvalContext::addDiag(DiagCode code, SourceLocation location) {
    const bool isError = getDefaultSeverity(code) >= DiagnosticSeverity::Error;
    auto& diag = isError ? diags.add(code, location) : warnings.add(code, location);
    reportStack(diag);
    return diag;
}